

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void __thiscall asl::Random::seed(Random *this,ULong s)

{
  long lVar1;
  int iVar2;
  
  lVar1 = 2;
  do {
    this->_state[lVar1 + -2] =
         (s ^ 0x7a12345fb678ce93) << ((byte)lVar1 & 0x3f) ^ s ^ 0x7a12345fb678ce93;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 6);
  iVar2 = 6;
  do {
    getLong(this);
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

void Random::seed(ULong s)
{
	s ^= 0x7a12345fb678ce93ull;
	for (int i = 0; i < _size; i++)
		_state[i] = s ^ (s << (i + 2));

	for (int i = 0; i < 6; i++)
		get();
}